

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O3

void __thiscall FTagManager::AddLineID(FTagManager *this,int line,int tag)

{
  uint *puVar1;
  uint uVar2;
  FTagItem *pFVar3;
  uint uVar4;
  int iVar5;
  int *piVar6;
  
  if (tag != -1) {
    if ((uint)line < (this->startForLine).Count) {
      piVar6 = (this->startForLine).Array;
    }
    else {
      do {
        TArray<int,_int>::Grow(&this->startForLine,1);
        piVar6 = (this->startForLine).Array;
        piVar6[(this->startForLine).Count] = -1;
        uVar4 = (this->startForLine).Count + 1;
        (this->startForLine).Count = uVar4;
      } while (uVar4 <= (uint)line);
    }
    uVar4 = piVar6[line];
    uVar2 = (this->allIDs).Count;
    if ((ulong)uVar4 == 0xffffffff) {
      piVar6[line] = uVar2;
    }
    else if (uVar4 < uVar2) {
      piVar6 = &(this->allIDs).Array[uVar4].tag;
      iVar5 = uVar2 - uVar4;
      do {
        if (*piVar6 == tag) {
          return;
        }
        piVar6 = piVar6 + 3;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    TArray<FTagItem,_FTagItem>::Grow(&this->allIDs,1);
    pFVar3 = (this->allIDs).Array;
    uVar4 = (this->allIDs).Count;
    pFVar3[uVar4].target = line;
    pFVar3[uVar4].tag = tag;
    pFVar3[uVar4].nexttag = -1;
    puVar1 = &(this->allIDs).Count;
    *puVar1 = *puVar1 + 1;
  }
  return;
}

Assistant:

void FTagManager::AddLineID(int line, int tag)
{
	if (tag == -1) return;	// For line IDs -1 means 'not set', unlike sectors.

	// This function assumes that all ids for a single line get added sequentially.
	while (startForLine.Size() <= (unsigned int)line)
	{
		startForLine.Push(-1);
	}
	if (startForLine[line] == -1)
	{
		startForLine[line] = allIDs.Size();
	}
	else
	{
		// check if the key was already defined
		for (unsigned i = startForLine[line]; i < allIDs.Size(); i++)
		{
			if (allIDs[i].tag == tag)
			{
				return;
			}
		}
	}
	FTagItem it = { line, tag, -1 };
	allIDs.Push(it);
}